

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<pbrt::Token> * __thiscall pbrt::Tokenizer::Next(Tokenizer *this)

{
  FileLoc loc;
  FileLoc loc_00;
  FileLoc loc_01;
  FileLoc loc_02;
  FileLoc loc_03;
  string_view token;
  char *__str;
  size_type __len;
  Tokenizer *in_RSI;
  optional<pbrt::Token> *in_RDI;
  char *vb;
  char *va;
  char *p;
  bool haveEscaped;
  int ch;
  FileLoc startLoc;
  char *tokenStart;
  FileLoc *in_stack_fffffffffffffdc8;
  Token *pTVar1;
  int in_stack_fffffffffffffdd0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 uVar3;
  char *in_stack_fffffffffffffdd8;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_fffffffffffffde0;
  char (*in_stack_fffffffffffffe18) [4];
  char (*in_stack_fffffffffffffe20) [2];
  char *in_stack_fffffffffffffe28;
  undefined4 local_1d0;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  LogLevel in_stack_fffffffffffffe44;
  char (*in_stack_fffffffffffffe50) [2];
  char **in_stack_fffffffffffffe58;
  char (*in_stack_fffffffffffffe60) [4];
  char **in_stack_fffffffffffffe68;
  string_view local_180;
  Token local_170;
  Token *local_148;
  char *local_140;
  undefined8 local_138;
  string_view local_130;
  Token local_120;
  Token *local_f8;
  char *local_f0;
  undefined8 local_e8;
  string_view local_e0;
  Token local_d0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  Token *local_90;
  char *local_88;
  undefined8 local_80;
  string_view local_78;
  Token local_68;
  byte local_3d;
  int local_3c;
  Token *local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  
  do {
    local_20 = in_RSI->pos;
    local_38 = (Token *)(in_RSI->loc).filename._M_len;
    local_30 = (in_RSI->loc).filename._M_str;
    local_28._0_4_ = (in_RSI->loc).line;
    local_28._4_4_ = (in_RSI->loc).column;
    local_3c = getChar(in_RSI);
    if (local_3c == -1) {
      memset(in_RDI,0,0x30);
      pstd::optional<pbrt::Token>::optional(in_RDI);
      return in_RDI;
    }
  } while ((((local_3c == 0x20) || (local_3c == 10)) || (local_3c == 9)) || (local_3c == 0xd));
  if (local_3c == 0x22) {
    local_3d = 0;
    local_3c = 0x22;
    do {
      do {
        local_3c = getChar(in_RSI);
        if (local_3c == 0x22) {
          if ((local_3d & 1) == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_78,local_20,(long)in_RSI->pos - (long)local_20);
            local_90 = local_38;
            local_88 = local_30;
            local_80 = local_28;
            uVar2 = SUB84(local_30,0);
            uVar3 = (undefined4)((ulong)local_30 >> 0x20);
            loc.filename._M_str._0_4_ = uVar2;
            loc.filename._M_len = (size_t)local_38;
            loc.filename._M_str._4_4_ = uVar3;
            loc.line = (undefined4)local_28;
            loc.column = local_28._4_4_;
            pTVar1 = local_38;
            Token::Token(&local_68,local_78,loc);
            pstd::optional<pbrt::Token>::optional
                      ((optional<pbrt::Token> *)CONCAT44(uVar3,uVar2),pTVar1);
            return in_RDI;
          }
          std::__cxx11::string::clear();
          local_98 = local_20;
          do {
            if (in_RSI->pos <= local_98) {
              __str = (char *)std::__cxx11::string::data();
              __len = std::__cxx11::string::size();
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_e0,__str,__len);
              local_f8 = local_38;
              local_f0 = local_30;
              local_e8 = local_28;
              uVar2 = SUB84(local_30,0);
              uVar3 = (undefined4)((ulong)local_30 >> 0x20);
              loc_00.filename._M_str._0_4_ = uVar2;
              loc_00.filename._M_len = (size_t)local_38;
              loc_00.filename._M_str._4_4_ = uVar3;
              loc_00.line = (undefined4)local_28;
              loc_00.column = local_28._4_4_;
              pTVar1 = local_38;
              Token::Token(&local_d0,local_e0,loc_00);
              pstd::optional<pbrt::Token>::optional
                        ((optional<pbrt::Token> *)CONCAT44(uVar3,uVar2),pTVar1);
              return in_RDI;
            }
            if (*local_98 == '\\') {
              local_a0 = local_98 + 1;
              local_a8 = in_RSI->pos;
              local_98 = local_a0;
              if (local_a8 <= local_a0) {
                LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],char_const*&,char_const(&)[4],char_const*&>
                          (in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
                           in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                           in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                           in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
              }
              decodeEscaped(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
              std::__cxx11::string::push_back((char)in_RSI + 'x');
            }
            else {
              std::__cxx11::string::push_back((char)in_RSI + 'x');
            }
            local_98 = local_98 + 1;
          } while( true );
        }
        if (local_3c == -1) {
          std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                    (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (FileLoc *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          memset(in_RDI,0,0x30);
          pstd::optional<pbrt::Token>::optional(in_RDI);
          return in_RDI;
        }
        if (local_3c == 10) {
          std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                    (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (FileLoc *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          memset(in_RDI,0,0x30);
          pstd::optional<pbrt::Token>::optional(in_RDI);
          return in_RDI;
        }
      } while (local_3c != 0x5c);
      local_3d = 1;
      local_3c = getChar(in_RSI);
    } while (local_3c != -1);
    std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (FileLoc *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    memset(in_RDI,0,0x30);
    pstd::optional<pbrt::Token>::optional(in_RDI);
  }
  else if ((local_3c == 0x5b) || (local_3c == 0x5d)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,local_20,1);
    local_148 = local_38;
    local_140 = local_30;
    local_138 = local_28;
    uVar2 = SUB84(local_30,0);
    uVar3 = (undefined4)((ulong)local_30 >> 0x20);
    loc_01.filename._M_str._0_4_ = uVar2;
    loc_01.filename._M_len = (size_t)local_38;
    loc_01.filename._M_str._4_4_ = uVar3;
    loc_01.line = (undefined4)local_28;
    loc_01.column = local_28._4_4_;
    pTVar1 = local_38;
    Token::Token(&local_120,local_130,loc_01);
    pstd::optional<pbrt::Token>::optional((optional<pbrt::Token> *)CONCAT44(uVar3,uVar2),pTVar1);
  }
  else if (local_3c == 0x23) {
    local_3c = 0x23;
    do {
      local_3c = getChar(in_RSI);
      if (local_3c == -1) goto LAB_0049adab;
    } while ((local_3c != 10) && (local_3c != 0xd));
    ungetChar(in_RSI);
LAB_0049adab:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_180,local_20,(long)in_RSI->pos - (long)local_20);
    uVar2 = SUB84(local_30,0);
    uVar3 = (undefined4)((ulong)local_30 >> 0x20);
    loc_02.filename._M_str._0_4_ = uVar2;
    loc_02.filename._M_len = (size_t)local_38;
    loc_02.filename._M_str._4_4_ = uVar3;
    loc_02.line = (undefined4)local_28;
    loc_02.column = local_28._4_4_;
    pTVar1 = local_38;
    Token::Token(&local_170,local_180,loc_02);
    pstd::optional<pbrt::Token>::optional((optional<pbrt::Token> *)CONCAT44(uVar3,uVar2),pTVar1);
  }
  else {
    do {
      local_3c = getChar(in_RSI);
      if (local_3c == -1) goto LAB_0049aec5;
    } while (((((local_3c != 0x20) && (local_3c != 10)) && (local_3c != 9)) &&
             ((local_3c != 0xd && (local_3c != 0x22)))) &&
            ((local_3c != 0x5b && (local_3c != 0x5d))));
    ungetChar(in_RSI);
LAB_0049aec5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&local_1d0,local_20,
               (long)in_RSI->pos - (long)local_20);
    token._M_len._4_4_ = in_stack_fffffffffffffe34;
    token._M_len._0_4_ = local_1d0;
    token._M_str = in_stack_fffffffffffffe38;
    uVar2 = SUB84(local_30,0);
    uVar3 = (undefined4)((ulong)local_30 >> 0x20);
    loc_03.filename._M_str._0_4_ = uVar2;
    loc_03.filename._M_len = (size_t)local_38;
    loc_03.filename._M_str._4_4_ = uVar3;
    loc_03.line = (undefined4)local_28;
    loc_03.column = local_28._4_4_;
    pTVar1 = local_38;
    Token::Token((Token *)&stack0xfffffffffffffe40,token,loc_03);
    pstd::optional<pbrt::Token>::optional((optional<pbrt::Token> *)CONCAT44(uVar3,uVar2),pTVar1);
  }
  return in_RDI;
}

Assistant:

pstd::optional<Token> Tokenizer::Next() {
    while (true) {
        const char *tokenStart = pos;
        FileLoc startLoc = loc;

        int ch = getChar();
        if (ch == EOF)
            return {};
        else if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r') {
            // nothing
        } else if (ch == '"') {
            // scan to closing quote
            bool haveEscaped = false;
            while ((ch = getChar()) != '"') {
                if (ch == EOF) {
                    errorCallback("premature EOF", &startLoc);
                    return {};
                } else if (ch == '\n') {
                    errorCallback("unterminated string", &startLoc);
                    return {};
                } else if (ch == '\\') {
                    haveEscaped = true;
                    // Grab the next character
                    if ((ch = getChar()) == EOF) {
                        errorCallback("premature EOF", &startLoc);
                        return {};
                    }
                }
            }

            if (!haveEscaped)
                return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
            else {
                sEscaped.clear();
                for (const char *p = tokenStart; p < pos; ++p) {
                    if (*p != '\\')
                        sEscaped.push_back(*p);
                    else {
                        ++p;
                        CHECK_LT(p, pos);
                        sEscaped.push_back(decodeEscaped(*p, startLoc));
                    }
                }
                return Token({sEscaped.data(), sEscaped.size()}, startLoc);
            }
        } else if (ch == '[' || ch == ']') {
            return Token({tokenStart, size_t(1)}, startLoc);
        } else if (ch == '#') {
            // comment: scan to EOL (or EOF)
            while ((ch = getChar()) != EOF) {
                if (ch == '\n' || ch == '\r') {
                    ungetChar();
                    break;
                }
            }

            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        } else {
            // Regular statement or numeric token; scan until we hit a
            // space, opening quote, or bracket.
            while ((ch = getChar()) != EOF) {
                if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r' || ch == '"' ||
                    ch == '[' || ch == ']') {
                    ungetChar();
                    break;
                }
            }
            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        }
    }
}